

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O3

void duckdb::QuantileOperation::
     WindowInit<duckdb::QuantileState<duckdb::dtime_t,duckdb::QuantileStandardType>,duckdb::dtime_t>
               (AggregateInputData *aggr_input_data,WindowPartitionInput *partition,
               data_ptr_t g_state)

{
  long lVar1;
  long lVar2;
  WindowQuantileState<duckdb::dtime_t> *this;
  QuantileSortTree *this_00;
  
  lVar1 = (partition->stats)._M_elems[1].begin;
  lVar2 = (partition->stats)._M_elems[0].end;
  if ((lVar2 <= lVar1) &&
     (0.75 < (double)(lVar1 - lVar2) /
             (double)((partition->stats)._M_elems[1].end - (partition->stats)._M_elems[0].begin))) {
    return;
  }
  this = QuantileState<duckdb::dtime_t,_duckdb::QuantileStandardType>::GetOrCreateWindowState
                   ((QuantileState<duckdb::dtime_t,_duckdb::QuantileStandardType> *)g_state);
  this_00 = (QuantileSortTree *)operator_new(8);
  QuantileSortTree::QuantileSortTree(this_00,aggr_input_data,partition);
  ::std::__uniq_ptr_impl<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>_>::
  reset((__uniq_ptr_impl<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>_> *
        )this,this_00);
  return;
}

Assistant:

static void WindowInit(AggregateInputData &aggr_input_data, const WindowPartitionInput &partition,
	                       data_ptr_t g_state) {
		D_ASSERT(partition.inputs);

		const auto &stats = partition.stats;

		//	If frames overlap significantly, then use local skip lists.
		if (stats[0].end <= stats[1].begin) {
			//	Frames can overlap
			const auto overlap = double(stats[1].begin - stats[0].end);
			const auto cover = double(stats[1].end - stats[0].begin);
			const auto ratio = overlap / cover;
			if (ratio > .75) {
				return;
			}
		}

		//	Build the tree
		auto &state = *reinterpret_cast<STATE *>(g_state);
		auto &window_state = state.GetOrCreateWindowState();
		window_state.qst = make_uniq<QuantileSortTree>(aggr_input_data, partition);
	}